

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::DockNodeBeginAmendTabBar(ImGuiDockNode *node)

{
  ImGuiTabBar *tab_bar;
  bool bVar1;
  bool bVar2;
  
  if (((node->TabBar == (ImGuiTabBar *)0x0) || (node->HostWindow == (ImGuiWindow *)0x0)) ||
     ((node->MergedFlags & 1) != 0)) {
    bVar2 = false;
  }
  else {
    Begin(node->HostWindow->Name,(bool *)0x0,0);
    PushOverrideID(node->ID);
    tab_bar = node->TabBar;
    bVar1 = BeginTabBarEx(tab_bar,&tab_bar->BarRect,tab_bar->Flags,node);
    bVar2 = true;
    if (!bVar1) {
      __assert_fail("ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x37bb,"bool ImGui::DockNodeBeginAmendTabBar(ImGuiDockNode *)");
    }
  }
  return bVar2;
}

Assistant:

bool ImGui::DockNodeBeginAmendTabBar(ImGuiDockNode* node)
{
    if (node->TabBar == NULL || node->HostWindow == NULL)
        return false;
    if (node->MergedFlags & ImGuiDockNodeFlags_KeepAliveOnly)
        return false;
    Begin(node->HostWindow->Name);
    PushOverrideID(node->ID);
    bool ret = BeginTabBarEx(node->TabBar, node->TabBar->BarRect, node->TabBar->Flags, node);
    IM_UNUSED(ret);
    IM_ASSERT(ret);
    return true;
}